

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfLut.cpp
# Opt level: O0

void __thiscall Imf_3_4::HalfLut::apply(HalfLut *this,Slice *data,Box2i *dataWindow)

{
  half hVar1;
  int *in_RDX;
  long in_RSI;
  int x;
  char *pixel;
  int y;
  char *base;
  halfFunction<Imath_3_2::half> *in_stack_ffffffffffffffa8;
  long lVar2;
  int local_34;
  uint16_t *local_30;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_RSI + 8) +
             *(long *)(in_RSI + 0x18) * (long)(in_RDX[1] / *(int *)(in_RSI + 0x24));
  for (local_24 = in_RDX[1]; local_24 <= in_RDX[3]; local_24 = *(int *)(in_RSI + 0x24) + local_24) {
    local_30 = (uint16_t *)
               (local_20 + *(long *)(in_RSI + 0x10) * (long)(*in_RDX / *(int *)(in_RSI + 0x20)));
    lVar2 = local_20;
    for (local_34 = *in_RDX; local_34 <= in_RDX[2]; local_34 = *(int *)(in_RSI + 0x20) + local_34) {
      hVar1 = halfFunction<Imath_3_2::half>::operator()
                        (in_stack_ffffffffffffffa8,(uint16_t)((ulong)lVar2 >> 0x20));
      *local_30 = hVar1._h;
      local_30 = (uint16_t *)(*(long *)(in_RSI + 0x10) + (long)local_30);
    }
    local_20 = *(long *)(in_RSI + 0x18) + local_20;
  }
  return;
}

Assistant:

void
HalfLut::apply (
    const Slice& data, const IMATH_NAMESPACE::Box2i& dataWindow) const
{
    assert (data.type == HALF);
    assert (dataWindow.min.x % data.xSampling == 0);
    assert (dataWindow.min.y % data.ySampling == 0);
    assert ((dataWindow.max.x - dataWindow.min.x + 1) % data.xSampling == 0);
    assert ((dataWindow.max.y - dataWindow.min.y + 1) % data.ySampling == 0);

    char* base = data.base + data.yStride * (dataWindow.min.y / data.ySampling);

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; y += data.ySampling)
    {
        char* pixel = base + data.xStride * (dataWindow.min.x / data.xSampling);

        for (int x = dataWindow.min.x; x <= dataWindow.max.x;
             x += data.xSampling)
        {
            *(half*) pixel = _lut (*(half*) pixel);
            pixel += data.xStride;
        }

        base += data.yStride;
    }
}